

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.h
# Opt level: O1

bool __thiscall pbrt::SquareMatrix<3>::operator<(SquareMatrix<3> *this,SquareMatrix<3> *m2)

{
  byte in_AL;
  Float *pFVar1;
  Float *pFVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  float fVar6;
  float fVar7;
  
  pFVar1 = m2->m[0] + 1;
  pFVar2 = this->m[0] + 1;
  lVar3 = 0;
  do {
    fVar6 = this->m[lVar3][0];
    fVar7 = m2->m[lVar3][0];
    bVar5 = false;
    if (fVar7 <= fVar6) {
      uVar4 = 0;
      do {
        if (fVar7 < fVar6) {
          in_AL = 0;
          goto LAB_002bbf04;
        }
        bVar5 = 1 < uVar4;
        if (uVar4 == 2) goto LAB_002bbf04;
        fVar6 = pFVar2[uVar4];
        fVar7 = pFVar1[uVar4];
        uVar4 = uVar4 + 1;
      } while (fVar7 <= fVar6);
    }
    in_AL = 1;
LAB_002bbf04:
    if (!bVar5) goto LAB_002bbf1d;
    lVar3 = lVar3 + 1;
    pFVar1 = pFVar1 + 3;
    pFVar2 = pFVar2 + 3;
  } while (lVar3 != 3);
  in_AL = 0;
LAB_002bbf1d:
  return (bool)(in_AL & 1);
}

Assistant:

PBRT_CPU_GPU
    bool operator<(const SquareMatrix<N> &m2) const {
        for (int i = 0; i < N; ++i)
            for (int j = 0; j < N; ++j) {
                if (m[i][j] < m2.m[i][j])
                    return true;
                if (m[i][j] > m2.m[i][j])
                    return false;
            }
        return false;
    }